

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy>::
encode_run_interruption_error
          (jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy> *this,
          context_run_mode *context,int32_t error_value)

{
  bool bVar1;
  int32_t k_00;
  int32_t iVar2;
  int mapped_error;
  int32_t iVar3;
  const_reference pvVar4;
  int32_t e_mapped_error_value;
  bool map;
  int32_t k;
  int32_t error_value_local;
  context_run_mode *context_local;
  jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy> *this_local;
  
  k_00 = context_run_mode::get_golomb_code(context);
  bVar1 = context_run_mode::compute_map(context,error_value,k_00);
  iVar3 = error_value;
  if (error_value < 1) {
    iVar3 = -error_value;
  }
  iVar2 = context_run_mode::run_interruption_type(context);
  mapped_error = (iVar3 * 2 - iVar2) - (uint)bVar1;
  iVar3 = context_run_mode::run_interruption_type(context);
  iVar3 = context_run_mode::compute_error_value(context,mapped_error + iVar3,k_00);
  if (error_value == iVar3) {
    pvVar4 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_);
    encode_mapped_value(this,k_00,mapped_error,0x3f - *pvVar4);
    context_run_mode::update_variables(context,error_value,mapped_error,this->reset_threshold_);
    return;
  }
  __assert_fail("error_value == context.compute_error_value(e_mapped_error_value + context.run_interruption_type(), k)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,0x306,
                "void charls::jls_codec<charls::lossless_traits<uint16_t, 16>, charls::encoder_strategy>::encode_run_interruption_error(context_run_mode &, const int32_t) [Traits = charls::lossless_traits<uint16_t, 16>, Strategy = charls::encoder_strategy]"
               );
}

Assistant:

void encode_run_interruption_error(context_run_mode& context, const int32_t error_value)
    {
        const int32_t k{context.get_golomb_code()};
        const bool map{context.compute_map(error_value, k)};
        const int32_t e_mapped_error_value{2 * std::abs(error_value) - context.run_interruption_type() -
                                           static_cast<int32_t>(map)};

        ASSERT(error_value == context.compute_error_value(e_mapped_error_value + context.run_interruption_type(), k));
        encode_mapped_value(k, e_mapped_error_value, traits_.limit - J[run_index_] - 1);
        context.update_variables(error_value, e_mapped_error_value, reset_threshold_);
    }